

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O3

int twin_messenger_get_twin_async
              (TWIN_MESSENGER_HANDLE twin_msgr_handle,
              TWIN_STATE_UPDATE_CALLBACK on_get_twin_completed_callback,void *context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  TWIN_OPERATION_CONTEXT *twin_op_ctx;
  int iVar3;
  char *pcVar4;
  
  if (twin_msgr_handle == (TWIN_MESSENGER_HANDLE)0x0 ||
      on_get_twin_completed_callback == (TWIN_STATE_UPDATE_CALLBACK)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x726;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x726;
    }
    pcVar4 = "Invalid argument (twin_msgr_handle=%p, on_get_twin_completed_callback=%p)";
    iVar3 = 0x725;
  }
  else {
    twin_op_ctx = create_twin_operation_context(twin_msgr_handle,TWIN_OPERATION_TYPE_GET_ON_DEMAND);
    if (twin_op_ctx != (TWIN_OPERATION_CONTEXT *)0x0) {
      (twin_op_ctx->cb).get_twin.callback = on_get_twin_completed_callback;
      (twin_op_ctx->cb).reported_properties.context = context;
      iVar1 = add_twin_operation_context_to_queue(twin_op_ctx);
      if (iVar1 != 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"twin_messenger_get_twin_async",0x739,1,
                    "Failed queueing TWIN request context (%s, TWIN_OPERATION_TYPE_GET_ON_DEMAND)",
                    twin_msgr_handle->device_id);
        }
        free(twin_op_ctx->correlation_id);
        free(twin_op_ctx);
        return 0x73c;
      }
      iVar1 = send_twin_operation_request(twin_msgr_handle,twin_op_ctx,(CONSTBUFFER_HANDLE)0x0);
      if (iVar1 == 0) {
        return 0;
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                  ,"twin_messenger_get_twin_async",0x740,1,
                  "Failed sending TWIN request (%s, TWIN_OPERATION_TYPE_GET_ON_DEMAND)",
                  twin_msgr_handle->device_id);
      }
      remove_twin_operation_context_from_queue(twin_op_ctx);
      free(twin_op_ctx->correlation_id);
      free(twin_op_ctx);
      return 0x744;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x730;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x730;
    }
    twin_msgr_handle = (TWIN_MESSENGER_HANDLE)twin_msgr_handle->device_id;
    pcVar4 = "Failed creating a context for TWIN request (%s, TWIN_OPERATION_TYPE_GET_ON_DEMAND)";
    iVar3 = 0x72f;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
            ,"twin_messenger_get_twin_async",iVar3,1,pcVar4,twin_msgr_handle);
  return iVar1;
}

Assistant:

int twin_messenger_get_twin_async(TWIN_MESSENGER_HANDLE twin_msgr_handle, TWIN_STATE_UPDATE_CALLBACK on_get_twin_completed_callback, void* context)
{
    int result;

    if (twin_msgr_handle == NULL || on_get_twin_completed_callback == NULL)
    {
        LogError("Invalid argument (twin_msgr_handle=%p, on_get_twin_completed_callback=%p)", twin_msgr_handle, on_get_twin_completed_callback);
        result = MU_FAILURE;
    }
    else
    {
        TWIN_MESSENGER_INSTANCE* twin_msgr = (TWIN_MESSENGER_INSTANCE*)twin_msgr_handle;
        TWIN_OPERATION_CONTEXT* twin_op_ctx;

        if ((twin_op_ctx = create_twin_operation_context(twin_msgr, TWIN_OPERATION_TYPE_GET_ON_DEMAND)) == NULL)
        {
            LogError("Failed creating a context for TWIN request (%s, TWIN_OPERATION_TYPE_GET_ON_DEMAND)", twin_msgr->device_id);
            result = MU_FAILURE;
        }
        else
        {
            twin_op_ctx->cb.get_twin.callback = on_get_twin_completed_callback;
            twin_op_ctx->cb.get_twin.context = context;

            if (add_twin_operation_context_to_queue(twin_op_ctx) != RESULT_OK)
            {
                LogError("Failed queueing TWIN request context (%s, TWIN_OPERATION_TYPE_GET_ON_DEMAND)", twin_msgr->device_id);

                destroy_twin_operation_context(twin_op_ctx);
                result = MU_FAILURE;
            }
            else if (send_twin_operation_request(twin_msgr, twin_op_ctx, NULL) != RESULT_OK)
            {
                LogError("Failed sending TWIN request (%s, TWIN_OPERATION_TYPE_GET_ON_DEMAND)", twin_msgr->device_id);

                (void)remove_twin_operation_context_from_queue(twin_op_ctx);
                destroy_twin_operation_context(twin_op_ctx);
                result = MU_FAILURE;
            }
            else
            {
                result = RESULT_OK;
            }
        }
    }

    return result;
}